

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArray<unsigned_char,_false,_false>::DirectSetItem
          (TypedArray<unsigned_char,_false,_false> *this,uint32 index,Var value)

{
  BOOL BVar1;
  Var value_local;
  uint32 index_local;
  TypedArray<unsigned_char,_false,_false> *this_local;
  
  BVar1 = BaseTypedDirectSetItem(this,index,value,JavascriptConversion::ToUInt8);
  return BVar1;
}

Assistant:

inline BOOL Uint8Array::DirectSetItem(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItem(index, value, JavascriptConversion::ToUInt8);
    }